

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O1

void __thiscall kj::_::Mutex::lock(Mutex *this,Exclusivity exclusivity)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  
  if (exclusivity == SHARED) {
    LOCK();
    uVar1 = this->futex;
    this->futex = this->futex + 1;
    UNLOCK();
    uVar3 = uVar1 + 1;
    while ((int)uVar3 < 0) {
      syscall(0xca,this,0x80,(ulong)uVar3,0,0,0);
      uVar3 = this->futex;
    }
  }
  else if (exclusivity == EXCLUSIVE) {
    do {
      uVar2 = 0;
      LOCK();
      bVar4 = this->futex == 0;
      if (bVar4) {
        this->futex = 0x80000000;
      }
      else {
        uVar2 = (ulong)this->futex;
      }
      UNLOCK();
      if (bVar4) {
        return;
      }
      uVar3 = (uint)uVar2;
      if ((uVar3 >> 0x1e & 1) == 0) {
        uVar2 = (ulong)(uVar3 | 0x40000000);
        LOCK();
        bVar5 = uVar3 == this->futex;
        if (bVar5) {
          this->futex = uVar3 | 0x40000000;
        }
        UNLOCK();
        if (bVar5) goto LAB_002ae0c9;
      }
      else {
LAB_002ae0c9:
        syscall(0xca,this,0x80,uVar2,0,0,0);
      }
    } while (!bVar4);
  }
  return;
}

Assistant:

void Mutex::lock(Exclusivity exclusivity) {
  switch (exclusivity) {
    case EXCLUSIVE:
      for (;;) {
        uint state = 0;
        if (KJ_LIKELY(__atomic_compare_exchange_n(&futex, &state, EXCLUSIVE_HELD, false,
                                                  __ATOMIC_ACQUIRE, __ATOMIC_RELAXED))) {
          // Acquired.
          break;
        }

        // The mutex is contended.  Set the exclusive-requested bit and wait.
        if ((state & EXCLUSIVE_REQUESTED) == 0) {
          if (!__atomic_compare_exchange_n(&futex, &state, state | EXCLUSIVE_REQUESTED, false,
                                           __ATOMIC_RELAXED, __ATOMIC_RELAXED)) {
            // Oops, the state changed before we could set the request bit.  Start over.
            continue;
          }

          state |= EXCLUSIVE_REQUESTED;
        }

        syscall(SYS_futex, &futex, FUTEX_WAIT_PRIVATE, state, NULL, NULL, 0);
      }
      break;
    case SHARED: {
      uint state = __atomic_add_fetch(&futex, 1, __ATOMIC_ACQUIRE);
      for (;;) {
        if (KJ_LIKELY((state & EXCLUSIVE_HELD) == 0)) {
          // Acquired.
          break;
        }

        // The mutex is exclusively locked by another thread.  Since we incremented the counter
        // already, we just have to wait for it to be unlocked.
        syscall(SYS_futex, &futex, FUTEX_WAIT_PRIVATE, state, NULL, NULL, 0);
        state = __atomic_load_n(&futex, __ATOMIC_ACQUIRE);
      }
      break;
    }
  }
}